

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.hpp
# Opt level: O3

string_t duckdb::StringParquetValueConversion::PlainRead<true>
                   (ByteBuffer *plain_data,ColumnReader *reader)

{
  StringColumnReader *pSVar1;
  uint str_len;
  idx_t iVar2;
  ulong req_len;
  data_ptr_t str_data;
  string_t sVar3;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  
  pSVar1 = ColumnReader::Cast<duckdb::StringColumnReader>(reader);
  iVar2 = pSVar1->fixed_width_string_length;
  if (iVar2 == 0) {
    ByteBuffer::available(plain_data,4);
    iVar2 = (idx_t)*(uint *)plain_data->ptr;
    plain_data->len = plain_data->len - 4;
    plain_data->ptr = (data_ptr_t)((long)plain_data->ptr + 4);
  }
  str_len = (uint)iVar2;
  req_len = iVar2 & 0xffffffff;
  ByteBuffer::available(plain_data,req_len);
  str_data = plain_data->ptr;
  StringColumnReader::VerifyString
            ((char *)str_data,str_len,
             (((pSVar1->super_ColumnReader).column_schema)->type).id_ == VARCHAR);
  if (str_len < 0xd) {
    local_2c = 0;
    uStack_34 = 0;
    uStack_30 = 0;
    if (req_len == 0) {
      str_data = (data_ptr_t)0x0;
    }
    else {
      switchD_012b9b0d::default(&uStack_34,str_data,req_len);
      str_data = (data_ptr_t)CONCAT44(local_2c,uStack_30);
    }
  }
  else {
    uStack_34 = *(undefined4 *)str_data;
  }
  ByteBuffer::available(plain_data,req_len);
  plain_data->len = plain_data->len - req_len;
  plain_data->ptr = plain_data->ptr + req_len;
  sVar3.value._4_1_ = (undefined1)uStack_34;
  sVar3.value._5_1_ = uStack_34._1_1_;
  sVar3.value._6_1_ = uStack_34._2_1_;
  sVar3.value._7_1_ = uStack_34._3_1_;
  sVar3.value.pointer.length = str_len;
  sVar3.value.pointer.ptr = (char *)str_data;
  return (string_t)sVar3.value;
}

Assistant:

static string_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &scr = reader.Cast<StringColumnReader>();
		uint32_t str_len =
		    scr.fixed_width_string_length == 0 ? plain_data.read<uint32_t>() : scr.fixed_width_string_length;
		plain_data.available(str_len);
		auto plain_str = char_ptr_cast(plain_data.ptr);
		scr.VerifyString(plain_str, str_len);
		auto ret_str = string_t(plain_str, str_len);
		plain_data.inc(str_len);
		return ret_str;
	}